

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListFlattenBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  pointer pEVar2;
  LogicalType *pLVar3;
  undefined8 in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType child_type;
  LogicalType *input_type;
  LogicalType child_type_2;
  LogicalType child_type_1;
  LogicalType *in_stack_fffffffffffffe08;
  LogicalType *in_stack_fffffffffffffe10;
  LogicalType *in_stack_fffffffffffffe18;
  LogicalType *in_stack_fffffffffffffe48;
  LogicalType local_170 [24];
  LogicalType local_158 [28];
  undefined4 local_13c;
  LogicalType local_130 [24];
  LogicalType local_118 [24];
  LogicalType local_100 [24];
  pointer local_e8;
  LogicalType local_e0 [24];
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  LogicalType local_b8 [24];
  LogicalType local_a0 [24];
  LogicalType local_88 [24];
  undefined1 local_70 [8];
  undefined1 local_68 [24];
  LogicalType local_50 [24];
  LogicalType local_38 [40];
  undefined8 local_10;
  
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffe10);
  LVar1 = LogicalType::id((LogicalType *)(pEVar2 + 0x38));
  if (LVar1 == ARRAY) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe10);
    pLVar3 = (LogicalType *)duckdb::ArrayType::GetChildType((LogicalType *)(pEVar2 + 0x38));
    duckdb::LogicalType::LogicalType(local_38,pLVar3);
    LVar1 = LogicalType::id(local_38);
    if (LVar1 == ARRAY) {
      duckdb::ArrayType::GetChildType(local_38);
      duckdb::LogicalType::LIST(local_50);
      LogicalType::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      duckdb::LogicalType::~LogicalType(local_50);
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe10,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe08);
    duckdb::LogicalType::LIST(local_88);
    duckdb::BoundCastExpression::AddCastToType(local_68,local_10,local_70,local_88,0);
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe10,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe08);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xd48598);
    duckdb::LogicalType::~LogicalType(local_88);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xd485b2);
    duckdb::LogicalType::~LogicalType(local_38);
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe10);
    LVar1 = LogicalType::id((LogicalType *)(pEVar2 + 0x38));
    if (LVar1 == LIST) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffe10);
      pLVar3 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pEVar2 + 0x38));
      duckdb::LogicalType::LogicalType(local_a0,pLVar3);
      LVar1 = LogicalType::id(local_a0);
      if (LVar1 == ARRAY) {
        duckdb::ArrayType::GetChildType(local_a0);
        duckdb::LogicalType::LIST(local_b8);
        LogicalType::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        duckdb::LogicalType::~LogicalType(local_b8);
        in_stack_fffffffffffffe48 =
             (LogicalType *)
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe08);
        duckdb::LogicalType::LIST(local_e0);
        duckdb::BoundCastExpression::AddCastToType(local_c0,local_10,local_c8,local_e0,0);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe08);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xd487ac);
        duckdb::LogicalType::~LogicalType(local_e0);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xd487c6);
      }
      duckdb::LogicalType::~LogicalType(local_a0);
    }
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  local_e8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe10);
  local_e8 = local_e8 + 0x38;
  vector<duckdb::LogicalType,_true>::operator[]
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe10,
             (size_type)in_stack_fffffffffffffe08);
  LogicalType::operator=(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  LVar1 = LogicalType::id((LogicalType *)local_e8);
  if (LVar1 == UNKNOWN) {
    duckdb::LogicalType::LogicalType(local_100,UNKNOWN);
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe10,
               (size_type)in_stack_fffffffffffffe08);
    LogicalType::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    duckdb::LogicalType::~LogicalType(local_100);
    duckdb::LogicalType::LogicalType(local_118,SQLNULL);
    LogicalType::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    duckdb::LogicalType::~LogicalType(local_118);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<std::default_delete<duckdb::FunctionData>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  else {
    pLVar3 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)local_e8);
    duckdb::LogicalType::LogicalType(local_130,pLVar3);
    LVar1 = LogicalType::id(local_130);
    if (LVar1 == SQLNULL) {
      LogicalType::operator=(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>(in_stack_fffffffffffffe48);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<duckdb::VariableReturnBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffe10,
                 (unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>_>
                  *)in_stack_fffffffffffffe08);
      unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
      ::~unique_ptr((unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
                     *)0xd48a21);
    }
    else {
      LVar1 = LogicalType::id(local_130);
      if (LVar1 == UNKNOWN) {
        duckdb::LogicalType::LogicalType(local_158,UNKNOWN);
        vector<duckdb::LogicalType,_true>::operator[]
                  ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe10,
                   (size_type)in_stack_fffffffffffffe08);
        pLVar3 = local_158;
        LogicalType::operator=(pLVar3,in_stack_fffffffffffffe08);
        duckdb::LogicalType::~LogicalType(pLVar3);
        duckdb::LogicalType::LogicalType(local_170,SQLNULL);
        LogicalType::operator=(pLVar3,in_stack_fffffffffffffe08);
        duckdb::LogicalType::~LogicalType(local_170);
        unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
        unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                  ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    *)pLVar3,in_stack_fffffffffffffe08);
      }
      else {
        LogicalType::operator=(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        make_uniq<duckdb::VariableReturnBindData,duckdb::LogicalType&>(in_stack_fffffffffffffe48);
        unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
        unique_ptr<duckdb::VariableReturnBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                  ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    *)in_stack_fffffffffffffe10,
                   (unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>_>
                    *)in_stack_fffffffffffffe08);
        unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
        ::~unique_ptr((unique_ptr<duckdb::VariableReturnBindData,_std::default_delete<duckdb::VariableReturnBindData>,_true>
                       *)0xd48b89);
      }
    }
    local_13c = 1;
    duckdb::LogicalType::~LogicalType(local_130);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListFlattenBind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 1);

	if (arguments[0]->return_type.id() == LogicalTypeId::ARRAY) {
		auto child_type = ArrayType::GetChildType(arguments[0]->return_type);
		if (child_type.id() == LogicalTypeId::ARRAY) {
			child_type = LogicalType::LIST(ArrayType::GetChildType(child_type));
		}
		arguments[0] =
		    BoundCastExpression::AddCastToType(context, std::move(arguments[0]), LogicalType::LIST(child_type));
	} else if (arguments[0]->return_type.id() == LogicalTypeId::LIST) {
		auto child_type = ListType::GetChildType(arguments[0]->return_type);
		if (child_type.id() == LogicalTypeId::ARRAY) {
			child_type = LogicalType::LIST(ArrayType::GetChildType(child_type));
			arguments[0] =
			    BoundCastExpression::AddCastToType(context, std::move(arguments[0]), LogicalType::LIST(child_type));
		}
	}

	auto &input_type = arguments[0]->return_type;
	bound_function.arguments[0] = input_type;
	if (input_type.id() == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalType(LogicalTypeId::UNKNOWN);
		bound_function.return_type = LogicalType(LogicalTypeId::SQLNULL);
		return nullptr;
	}
	D_ASSERT(input_type.id() == LogicalTypeId::LIST);

	auto child_type = ListType::GetChildType(input_type);
	if (child_type.id() == LogicalType::SQLNULL) {
		bound_function.return_type = input_type;
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}
	if (child_type.id() == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalType(LogicalTypeId::UNKNOWN);
		bound_function.return_type = LogicalType(LogicalTypeId::SQLNULL);
		return nullptr;
	}
	D_ASSERT(child_type.id() == LogicalTypeId::LIST);

	bound_function.return_type = child_type;
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}